

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::ImageCopyToImage::prepare
          (ImageCopyToImage *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  Context *pCVar2;
  InstanceInterface *vki;
  DeviceInterface *vk;
  VkDevice device;
  VkImage obj;
  VkDeviceMemory obj_00;
  deUint64 dVar3;
  VkResult result;
  VkCommandBufferLevel level;
  VkDevice pVVar4;
  Handle<(vk::HandleType)9> HVar5;
  VkDeviceMemory obj_01;
  Handle<(vk::HandleType)7> commandBuffer;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_f0;
  Move<vk::Handle<(vk::HandleType)9>_> local_d8;
  VkQueue local_b8;
  VkCommandPool local_b0;
  VkPhysicalDevice local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  VkImageCreateInfo createInfo;
  
  pCVar2 = context->m_context;
  vki = pCVar2->m_vki;
  vk = pCVar2->m_vkd;
  local_a8 = pCVar2->m_physicalDevice;
  device = pCVar2->m_device;
  local_b8 = pCVar2->m_queue;
  local_b0.m_internal =
       (pCVar2->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
       m_internal;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_a0,&pCVar2->m_queueFamilies);
  createInfo.extent.width = context->m_currentImageWidth;
  this->m_imageWidth = createInfo.extent.width;
  createInfo.extent.height = context->m_currentImageHeight;
  this->m_imageHeight = createInfo.extent.height;
  this->m_imageMemorySize = context->m_currentImageMemorySize;
  createInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  createInfo.pNext = (void *)0x0;
  createInfo.flags = 0;
  createInfo.imageType = VK_IMAGE_TYPE_2D;
  createInfo.format = VK_FORMAT_R8G8B8A8_UNORM;
  createInfo.extent.depth = 1;
  createInfo.mipLevels = 1;
  createInfo.arrayLayers = 1;
  createInfo.samples = VK_SAMPLE_COUNT_1_BIT;
  createInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  createInfo.usage = 3;
  createInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  createInfo.queueFamilyIndexCount =
       (deUint32)
       ((ulong)((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2);
  createInfo.pQueueFamilyIndices =
       local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  createInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::createImage(&local_d8,vk,device,&createInfo,(VkAllocationCallbacks *)0x0);
  HVar5.m_internal = local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
  ;
  DStack_f0.m_device =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  DStack_f0.m_allocator =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  DStack_f0.m_deviceIface =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,obj)
    ;
  }
  pMVar1 = &this->m_dstImage;
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       DStack_f0.m_device;
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       DStack_f0.m_allocator;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
       HVar5.m_internal;
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       DStack_f0.m_deviceIface;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  pVVar4 = device;
  bindImageMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&stack0xffffffffffffff08,vki,vk,local_a8,
                  device,(VkImage)(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.
                                  object.m_internal,(VkMemoryPropertyFlags)HVar5.m_internal);
  level = (VkCommandBufferLevel)pVVar4;
  createInfo._16_8_ = DStack_f0.m_device;
  createInfo._24_8_ = DStack_f0.m_allocator;
  createInfo.pNext = DStack_f0.m_deviceIface;
  obj_01.m_internal = 0;
  DStack_f0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_f0.m_device = (VkDevice)0x0;
  DStack_f0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  createInfo._0_8_ = HVar5.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,obj_00
              );
  }
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)createInfo._16_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)createInfo._24_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       createInfo._0_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)createInfo.pNext;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_f0,obj_01);
  }
  createBeginCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&createInfo,vk,device,local_b0,level);
  commandBuffer.m_internal = createInfo._0_8_;
  DStack_f0.m_device = (VkDevice)createInfo._16_8_;
  DStack_f0.m_allocator = (VkAllocationCallbacks *)createInfo._24_8_;
  DStack_f0.m_deviceIface = (DeviceInterface *)createInfo.pNext;
  createInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  createInfo.pNext = (void *)0x0;
  createInfo.flags = 0;
  createInfo.imageType = 0x1000;
  createInfo.format = VK_FORMAT_UNDEFINED;
  createInfo.extent.width = 7;
  createInfo.extent.height = 0xffffffff;
  createInfo.extent.depth = 0xffffffff;
  dVar3 = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  createInfo.mipLevels = (deUint32)dVar3;
  createInfo.arrayLayers = (deUint32)(dVar3 >> 0x20);
  createInfo.samples = VK_SAMPLE_COUNT_1_BIT;
  createInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  createInfo.usage = 1;
  createInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  createInfo.queueFamilyIndexCount = 1;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer.m_internal,0x10000,0x1000,0,0,0,0,0,1,&createInfo);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer.m_internal);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xd8f);
  queueRun(vk,local_b8,(VkCommandBuffer)commandBuffer.m_internal);
  if ((VkCommandBuffer)commandBuffer.m_internal != (VkCommandBuffer)0x0) {
    createInfo._0_8_ = commandBuffer.m_internal;
    (*(DStack_f0.m_deviceIface)->_vptr_DeviceInterface[0x48])
              (DStack_f0.m_deviceIface,DStack_f0.m_device,DStack_f0.m_allocator,1);
  }
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (deUint32 *)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImageCopyToImage::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vk::VkQueue				queue			= context.getContext().getQueue();
	const vk::VkCommandPool			commandPool		= context.getContext().getCommandPool();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_imageWidth		= context.getImageWidth();
	m_imageHeight		= context.getImageHeight();
	m_imageMemorySize	= context.getImageMemorySize();

	{
		const vk::VkImageCreateInfo	createInfo =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,

			0,
			vk::VK_IMAGE_TYPE_2D,
			vk::VK_FORMAT_R8G8B8A8_UNORM,
			{
				(deUint32)m_imageWidth,
				(deUint32)m_imageHeight,
				1u,
			},
			1, 1, // mipLevels, arrayLayers
			vk::VK_SAMPLE_COUNT_1_BIT,

			vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
			vk::VK_SHARING_MODE_EXCLUSIVE,

			(deUint32)queueFamilies.size(),
			&queueFamilies[0],
			vk::VK_IMAGE_LAYOUT_UNDEFINED
		};

		m_dstImage = vk::createImage(vkd, device, &createInfo);
	}

	m_memory = bindImageMemory(vki, vkd, physicalDevice, device, *m_dstImage, 0);

	{
		const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const vk::VkImageMemoryBarrier			barrier			=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			0,
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,

			vk::VK_IMAGE_LAYOUT_UNDEFINED,
			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_dstImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &barrier);

		VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
		queueRun(vkd, queue, *commandBuffer);
	}
}